

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Ramp.cpp
# Opt level: O1

void __thiscall chrono::ChFunction_Ramp::ArchiveIN(ChFunction_Ramp *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Ramp>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30 = &this->y0;
  local_38 = "y0";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->ang;
  local_38 = "ang";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_Ramp::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Ramp>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(y0);
    marchive >> CHNVP(ang);
}